

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O2

ostream * dg::llvmdg::anon_unknown_6::printLLVMVal(ostream *os,Value *val)

{
  Value VVar1;
  raw_ostream *prVar2;
  raw_os_ostream *this;
  ulong uVar3;
  char *pcVar4;
  StringRef SVar5;
  raw_os_ostream ro;
  string str;
  ostringstream ostr;
  
  if (val == (Value *)0x0) {
    std::operator<<(os,"(null)");
    return os;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  _ro = std::__throw_length_error;
  VVar1 = val[0x10];
  if (VVar1 == (Value)0x15) {
    SVar5 = (StringRef)llvm::Value::getName();
    prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&ro,SVar5);
    llvm::raw_ostream::operator<<(prVar2,"::");
    pcVar4 = "label ";
  }
  else {
    if (VVar1 != (Value)0x0) {
      if (0x1a < (byte)VVar1) {
        if (*(long *)(val + 0x28) == 0) {
          pcVar4 = "<null>::";
          this = &ro;
        }
        else {
          SVar5 = (StringRef)llvm::Value::getName();
          this = (raw_os_ostream *)llvm::raw_ostream::operator<<((raw_ostream *)&ro,SVar5);
          pcVar4 = "::";
        }
        llvm::raw_ostream::operator<<((raw_ostream *)this,pcVar4);
      }
      llvm::operator<<((raw_ostream *)&ro,val);
      goto LAB_00119af1;
    }
    pcVar4 = "FUN ";
  }
  prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&ro,pcVar4);
  SVar5 = (StringRef)llvm::Value::getName();
  llvm::raw_ostream::operator<<(prVar2,SVar5);
LAB_00119af1:
  llvm::raw_ostream::flush((raw_ostream *)&ro);
  std::__cxx11::stringbuf::str();
  if (0x32 < str._M_string_length) {
    std::__cxx11::string::resize((ulong)&str);
  }
  while (uVar3 = std::__cxx11::string::find((char)&str,0x22), uVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&str,uVar3,(char *)0x1);
  }
  std::operator<<(os,(string *)&str);
  std::__cxx11::string::_M_dispose();
  llvm::raw_os_ostream::~raw_os_ostream(&ro);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  return os;
}

Assistant:

inline std::ostream &printLLVMVal(std::ostream &os, const llvm::Value *val) {
    if (!val) {
        os << "(null)";
        return os;
    }

    std::ostringstream ostr;
    llvm::raw_os_ostream ro(ostr);

    if (llvm::isa<llvm::Function>(val)) {
        ro << "FUN " << val->getName();
    } else if (const auto *B = llvm::dyn_cast<llvm::BasicBlock>(val)) {
        ro << B->getParent()->getName() << "::";
        ro << "label " << val->getName();
    } else if (const auto *I = llvm::dyn_cast<llvm::Instruction>(val)) {
        const auto *const B = I->getParent();
        if (B) {
            ro << B->getParent()->getName() << "::";
        } else {
            ro << "<null>::";
        }
        ro << *val;
    } else {
        ro << *val;
    }

    ro.flush();

    // break the string if it is too long
    std::string str = ostr.str();
    if (str.length() > 50) {
        str.resize(40);
    }

    // escape the "
    size_t pos = 0;
    while ((pos = str.find('"', pos)) != std::string::npos) {
        str.replace(pos, 1, "\\\"");
        // we replaced one char with two, so we must shift after the new "
        pos += 2;
    }

    os << str;

    return os;
}